

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QString * __thiscall QMimeData::text(QMimeData *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QVariant data;
  QVariant utf8Text;
  QMetaType in_stack_000003b8;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QVariant *in_stack_ffffffffffffff20;
  QVariant *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMimeData *)0x3e5ddd);
  textPlainUtf8Literal();
  QMetaType::QMetaType((QMetaType *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  QMimeDataPrivate::retrieveTypedData
            ((QMimeDataPrivate *)data.d._24_8_,(QString *)data.d.data._16_8_,in_stack_000003b8);
  QString::~QString((QString *)0x3e5e5c);
  bVar2 = ::QVariant::isNull(in_stack_ffffffffffffff28);
  if (bVar2) {
    textPlainLiteral();
    QMetaType::QMetaType((QMetaType *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    QMimeDataPrivate::retrieveTypedData
              ((QMimeDataPrivate *)data.d._24_8_,(QString *)data.d.data._16_8_,in_stack_000003b8);
    QString::~QString((QString *)0x3e5f42);
    ::QVariant::toString((QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    ::QVariant::~QVariant(in_stack_ffffffffffffff20);
  }
  else {
    ::QVariant::toString((QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  ::QVariant::~QVariant(in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeData::text() const
{
    Q_D(const QMimeData);
    QVariant utf8Text = d->retrieveTypedData(textPlainUtf8Literal(), QMetaType(QMetaType::QString));
    if (!utf8Text.isNull())
        return utf8Text.toString();

    QVariant data = d->retrieveTypedData(textPlainLiteral(), QMetaType(QMetaType::QString));
    return data.toString();
}